

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

void MpiDestroyWriter(CP_Services Svcs,DP_WS_Stream WS_Stream_v)

{
  CP_VerboseFunc __ptr;
  CP_VerboseFunc p_Var1;
  CP_Services in_RSI;
  undefined8 *in_RDI;
  TimeStepsEntry Entry;
  MpiStreamWPR Stream;
  MpiStreamWR StreamWR;
  CP_Services Svcs_00;
  
  Svcs_00 = in_RSI;
  (*(code *)*in_RDI)(in_RSI->verbose,5,"MpiDestroyWriter invoked [rank:%d]\n",
                     *(undefined4 *)&in_RSI->getCManager);
  pthread_mutex_lock((pthread_mutex_t *)&in_RSI[3].getMPIComm);
  while (in_RSI[1].sendToPeer != (CP_SendToPeerFunc)0x0) {
    MpiDestroyWriterPerReader(Svcs_00,in_RSI);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&in_RSI[3].getMPIComm);
  pthread_rwlock_wrlock((pthread_rwlock_t *)(in_RSI + 2));
  while (in_RSI[1].verbose != (CP_VerboseFunc)0x0) {
    __ptr = in_RSI[1].verbose;
    p_Var1 = *(CP_VerboseFunc *)(in_RSI[1].verbose + 0x10);
    in_RSI[1].verbose = p_Var1;
    if (p_Var1 == (CP_VerboseFunc)0x0) {
      in_RSI[1].getCManager = (CP_GetCManagerFunc)(in_RSI + 1);
    }
    free(*(void **)(__ptr + 8));
    free(__ptr);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)(in_RSI + 2));
  pthread_mutex_destroy((pthread_mutex_t *)&in_RSI[3].getMPIComm);
  pthread_rwlock_destroy((pthread_rwlock_t *)(in_RSI + 2));
  free(in_RSI);
  return;
}

Assistant:

static void MpiDestroyWriter(CP_Services Svcs, DP_WS_Stream WS_Stream_v)
{
    MpiStreamWR StreamWR = (MpiStreamWR)WS_Stream_v;

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MpiDestroyWriter invoked [rank:%d]\n", StreamWR->Stream.Rank);

    pthread_mutex_lock(&StreamWR->MutexReaders);
    while (!TAILQ_EMPTY(&StreamWR->Readers))
    {
        MpiStreamWPR Stream = TAILQ_FIRST(&StreamWR->Readers);
        MpiDestroyWriterPerReader(Svcs, Stream);
    }
    pthread_mutex_unlock(&StreamWR->MutexReaders);

    pthread_rwlock_wrlock(&StreamWR->LockTS);
    while (!STAILQ_EMPTY(&StreamWR->TimeSteps))
    {
        TimeStepsEntry Entry = STAILQ_FIRST(&StreamWR->TimeSteps);
        STAILQ_REMOVE_HEAD(&StreamWR->TimeSteps, entries);
        free(Entry->Data);
        free(Entry);
    }
    pthread_rwlock_unlock(&StreamWR->LockTS);

    pthread_mutex_destroy(&StreamWR->MutexReaders);
    pthread_rwlock_destroy(&StreamWR->LockTS);
    free(StreamWR);
}